

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

string * duckdb::StringUtil::Lower(string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  pointer pcVar2;
  size_type sVar3;
  size_type sVar4;
  byte bVar5;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar3 = __return_storage_ptr__->_M_string_length;
  for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
    bVar1 = pcVar2[sVar4];
    bVar5 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar5 = bVar1;
    }
    pcVar2[sVar4] = bVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

string StringUtil::Lower(const string &str) {
	string copy(str);
	transform(copy.begin(), copy.end(), copy.begin(),
	          [](unsigned char c) { return StringUtil::CharacterToLower(static_cast<char>(c)); });
	return (copy);
}